

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall Excel::Exception::~Exception(Exception *this)

{
  *(undefined ***)this = &PTR__Exception_001287f8;
  std::__cxx11::wstring::~wstring((wstring *)&this->m_what);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

inline
Exception::~Exception() noexcept
{
}